

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnGetBool(XL *out,char *key,bool *value)

{
  XL pvVar1;
  int iVar2;
  undefined1 uVar3;
  
  pvVar1 = *out;
  iVar2 = strcmp(key,"on_disk");
  if (iVar2 == 0) {
    uVar3 = *(undefined1 *)((long)pvVar1 + 1);
  }
  else {
    iVar2 = strcmp(key,"quiet");
    if (iVar2 == 0) {
      uVar3 = *(undefined1 *)((long)pvVar1 + 2);
    }
    else {
      iVar2 = strcmp(key,"norm");
      if (iVar2 == 0) {
        uVar3 = *(undefined1 *)((long)pvVar1 + 0xb4);
      }
      else {
        iVar2 = strcmp(key,"lock_free");
        if (iVar2 == 0) {
          uVar3 = *(undefined1 *)((long)pvVar1 + 0xb5);
        }
        else {
          iVar2 = strcmp(key,"early_stop");
          if (iVar2 == 0) {
            uVar3 = *(undefined1 *)((long)pvVar1 + 500);
          }
          else {
            iVar2 = strcmp(key,"sign");
            if (iVar2 == 0) {
              uVar3 = value != (bool *)0x0;
              *(undefined1 *)((long)pvVar1 + 0x1fc) = uVar3;
            }
            else {
              iVar2 = strcmp(key,"sigmoid");
              if (iVar2 != 0) {
                return 0;
              }
              uVar3 = *(undefined1 *)((long)pvVar1 + 0x1fd);
            }
          }
        }
      }
    }
  }
  *value = (bool)uVar3;
  return 0;
}

Assistant:

XL_DLL int XLearnGetBool(XL *out, const char *key, bool *value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "on_disk") == 0) {
    *value = xl->GetHyperParam().on_disk;
  } else if (strcmp(key, "quiet") == 0) {
    *value = xl->GetHyperParam().quiet;
  } else if (strcmp(key, "norm") == 0) {
    *value = xl->GetHyperParam().norm;
  } else if (strcmp(key, "lock_free") == 0) {
    *value = xl->GetHyperParam().lock_free;
  } else if (strcmp(key, "early_stop") == 0) {
    *value = xl->GetHyperParam().early_stop;
  } else if (strcmp(key, "sign") == 0) {
    *value = xl->GetHyperParam().sign = value;
  } else if (strcmp(key, "sigmoid") == 0) {
    *value = xl->GetHyperParam().sigmoid;
  }
  API_END();
}